

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

bool llvm::sys::path::has_parent_path(Twine *path,Style style)

{
  size_t sVar1;
  ulong uVar2;
  StringRef path_00;
  SmallString<128U> path_storage;
  SmallVectorImpl<char> local_b8;
  undefined1 local_a8 [128];
  
  local_b8.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_b8.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x80;
  local_b8.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_a8;
  path_00 = Twine::toStringRef(path,&local_b8);
  sVar1 = anon_unknown.dwarf_389211::parent_path_end(path_00,style);
  if ((undefined1 *)
      local_b8.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
      .super_SmallVectorBase.BeginX != local_a8) {
    free(local_b8.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  uVar2 = path_00.Length;
  if (sVar1 < path_00.Length) {
    uVar2 = sVar1;
  }
  return sVar1 != 0xffffffffffffffff && uVar2 != 0;
}

Assistant:

bool has_parent_path(const Twine &path, Style style) {
  SmallString<128> path_storage;
  StringRef p = path.toStringRef(path_storage);

  return !parent_path(p, style).empty();
}